

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O1

mpt_metatype * mpt_rawdata_create(long max)

{
  int *piVar1;
  mpt_metatype *pmVar2;
  _mpt_vptr_metatype *p_Var3;
  
  if (max == 0x7fffffffffffffff) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  else {
    pmVar2 = (mpt_metatype *)malloc(0x30);
    if (pmVar2 != (mpt_metatype *)0x0) {
      p_Var3 = (_mpt_vptr_metatype *)0x0;
      if (0 < max) {
        p_Var3 = (_mpt_vptr_metatype *)max;
      }
      pmVar2[4]._vptr = (_mpt_vptr_metatype *)0;
      pmVar2[5]._vptr = (_mpt_vptr_metatype *)0;
      pmVar2[2]._vptr = (_mpt_vptr_metatype *)1;
      pmVar2[3]._vptr = (_mpt_vptr_metatype *)(mpt_buffer *)0x0;
      pmVar2->_vptr = &mpt_rawdata_create::meta;
      pmVar2[1]._vptr = (_mpt_vptr_metatype *)&mpt_rawdata_create::raw;
      pmVar2[5]._vptr = p_Var3;
      return pmVar2;
    }
  }
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_rawdata_create(long max)
{
	static const MPT_INTERFACE_VPTR(metatype) meta = {
		{ rd_conv },
		rd_unref,
		rd_ref,
		rd_clone
	};
	static const MPT_INTERFACE_VPTR(rawdata) raw = {
		rd_modify,
		rd_advance,
		rd_values,
		rd_dimensions,
		rd_stages
	};
	static const MPT_STRUCT(RawData) def = {
		{ &meta },
		{ &raw },
		{ 1 },
		MPT_ARRAY_INIT,
		0, 0
	};
	MPT_STRUCT(RawData) *rd;
	
	if (max >= LONG_MAX) {
		errno = EINVAL;
		return 0;
	}
	if (max < 0) {
		max = 0;
	}
	if (!(rd = malloc(sizeof(*rd)))) {
		return 0;
	}
	*rd = def;
	rd->max = max;
	
	return &rd->_mt;
}